

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OStream.h
# Opt level: O3

ostream * Gs::Details::ShiftAffineMatrixOStream<Gs::AffineMatrix4T<float>,float>
                    (ostream *stream,AffineMatrix4T<float> *mat)

{
  undefined1 uVar1;
  size_t sVar2;
  size_t sVar3;
  ostream *poVar4;
  long lVar5;
  float *value;
  ulong uVar6;
  size_t c;
  long lVar7;
  size_t lengths [4];
  char *local_88;
  long local_80;
  char local_78 [16];
  float *local_68;
  long local_60;
  size_t asStack_58 [5];
  
  lVar7 = 0;
  local_68 = mat->m_;
  do {
    asStack_58[lVar7] = 0;
    lVar5 = 0;
    uVar6 = 0;
    do {
      sVar2 = Length<float>((float *)((long)mat + lVar5));
      if (uVar6 <= sVar2) {
        uVar6 = sVar2;
      }
      asStack_58[lVar7] = uVar6;
      lVar5 = lVar5 + 4;
    } while (lVar5 != 0xc);
    lVar7 = lVar7 + 1;
    mat = (AffineMatrix4T<float> *)((long)mat + 0xc);
  } while (lVar7 != 4);
  lVar7 = 0;
  value = local_68;
  do {
    uVar1 = 0x7c;
    if (lVar7 == 0) {
      uVar1 = 0x2f;
    }
    local_60 = lVar7;
    local_88._0_1_ = uVar1;
    std::__ostream_insert<char,std::char_traits<char>>(stream,(char *)&local_88,1);
    lVar5 = 0;
    local_68 = value;
    do {
      sVar2 = asStack_58[lVar5];
      sVar3 = Length<float>(value);
      local_88 = local_78;
      std::__cxx11::string::_M_construct((ulong)&local_88,((char)sVar2 - (char)sVar3) + '\x01');
      std::__ostream_insert<char,std::char_traits<char>>(stream,local_88,local_80);
      if (local_88 != local_78) {
        operator_delete(local_88);
      }
      poVar4 = std::ostream::_M_insert<double>((double)*value);
      local_88._0_1_ = 0x20;
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)&local_88,1);
      lVar7 = local_60;
      lVar5 = lVar5 + 1;
      value = value + 3;
    } while (lVar5 != 4);
    local_88 = (char *)(CONCAT71(local_88._1_7_,(local_60 != 0) << 5) | 0x5c);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>(stream,(char *)&local_88,1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    lVar7 = lVar7 + 1;
    value = local_68 + 1;
  } while (lVar7 != 3);
  local_88 = (char *)CONCAT71(local_88._1_7_,0x5c);
  std::__ostream_insert<char,std::char_traits<char>>(stream,(char *)&local_88,1);
  lVar7 = 0;
  do {
    local_88 = local_78;
    std::__cxx11::string::_M_construct((ulong)&local_88,(char)asStack_58[lVar7]);
    std::__ostream_insert<char,std::char_traits<char>>(stream,local_88,local_80);
    if (local_88 != local_78) {
      operator_delete(local_88);
    }
    lVar5 = lVar7 + 1;
    local_88 = (char *)(CONCAT71(local_88._1_7_,lVar7 == 3) | 0x30);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>(stream,(char *)&local_88,1);
    local_88._0_1_ = 0x20;
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)&local_88,1);
    lVar7 = lVar5;
  } while (lVar5 != 4);
  local_88 = (char *)CONCAT71(local_88._1_7_,0x2f);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>(stream,(char *)&local_88,1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  return stream;
}

Assistant:

std::ostream& ShiftAffineMatrixOStream(std::ostream& stream, const M& mat)
{
    /* Determine longest elements for each row */
    std::size_t lengths[M::columnsSparse];

    for (std::size_t c = 0; c < M::columnsSparse; ++c)
    {
        lengths[c] = 0;
        for (std::size_t r = 0; r < M::rowsSparse; ++r)
            lengths[c] = std::max<std::size_t>(lengths[c], Details::Length(mat(r, c)));
    }

    #if GS_ROW_VECTORS

    /* Write each row */
    for (std::size_t r = 0; r < M::rowsSparse; ++r)
    {
        stream << (r == 0 ? '/' : r + 1 == M::rowsSparse ? '\\' : '|');

        for (std::size_t c = 0; c < M::columnsSparse; ++c)
        {
            stream << std::string(lengths[c] + 1u - Details::Length(mat(r, c)), ' ');
            stream << mat(r, c) << ' ';
        }

        /* Write implicit column */
        stream << ' ' << (r + 1 == M::rowsSparse ? '1' : '0');
        stream << ' ' << (r == 0 ? '\\' : r + 1 == M::rowsSparse ? '/' : '|')  << std::endl;
    }

    #else

    /* Write each row */
    for (std::size_t r = 0; r < M::rowsSparse; ++r)
    {
        stream << (r == 0 ? '/' : '|');

        for (std::size_t c = 0; c < M::columnsSparse; ++c)
        {
            stream << std::string(lengths[c] + 1u - Details::Length(mat(r, c)), ' ');
            stream << mat(r, c) << ' ';
        }

        stream << (r == 0 ? '\\' : '|')  << std::endl;
    }

    /* Write implicit row */
    stream << '\\';

    for (std::size_t c = 0; c < M::columnsSparse; ++c)
    {
        stream << std::string(lengths[c], ' ');
        stream << (c + 1 == M::columnsSparse ? '1' : '0') << ' ';
    }

    stream << '/' << std::endl;

    #endif

    return stream;
}